

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void calc_proj_params_r0_r1_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C)

{
  undefined8 *puVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int in_ECX;
  int iVar29;
  ulong in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int iVar30;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  long in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  uint in_stack_00000020;
  long *in_stack_00000028;
  __m128i h1x_high;
  __m128i h1x_low;
  __m128i h0x_high;
  __m128i h0x_low;
  __m128i c_high;
  __m128i c_low;
  __m128i c1_odd;
  __m128i c1_even;
  __m128i c0_odd;
  __m128i c0_even;
  __m128i h11_odd;
  __m128i h11_even;
  __m128i h01_odd;
  __m128i h01_even;
  __m128i h00_odd;
  __m128i h00_even;
  __m128i s;
  __m128i d;
  __m128i f2;
  __m128i f1;
  __m128i s_load;
  __m128i u_load;
  int j;
  int i;
  __m128i zero;
  __m128i c1;
  __m128i c0;
  __m128i h11;
  __m128i h01;
  __m128i h00;
  uint8_t *dat;
  uint8_t *src;
  int size;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  int local_6a0;
  int local_69c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  
  iVar29 = (int)in_RDX;
  iVar28 = (int)in_RSI * iVar29;
  for (local_69c = 0; local_69c < iVar29; local_69c = local_69c + 1) {
    for (local_6a0 = 0; local_6a0 < (int)in_RSI; local_6a0 = local_6a0 + 4) {
      uVar33 = *(uint *)((long)local_6a0 + in_R8 + local_69c * in_R9D);
      auVar31 = pmovzxbd(ZEXT416(uVar33),uVar33);
      uVar33 = *(uint *)((long)local_6a0 + in_RDI + local_69c * in_ECX);
      auVar32 = pmovzxbd(ZEXT416(uVar33),uVar33);
      puVar1 = (undefined8 *)
               (in_stack_00000008 + (long)(local_69c * in_stack_00000010) * 4 + (long)local_6a0 * 4)
      ;
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      in_RDX = (ulong)in_stack_00000020;
      puVar1 = (undefined8 *)
               (in_stack_00000018 + (long)(int)(local_69c * in_stack_00000020) * 4 +
               (long)local_6a0 * 4);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      local_358 = auVar31._0_4_;
      iStack_354 = auVar31._4_4_;
      iStack_350 = auVar31._8_4_;
      iStack_34c = auVar31._12_4_;
      local_378 = auVar32._0_4_;
      iStack_374 = auVar32._4_4_;
      iStack_370 = auVar32._8_4_;
      iStack_36c = auVar32._12_4_;
      iVar30 = local_378 * 0x10 + local_358 * -0x10;
      uVar33 = iStack_374 - iStack_354;
      iStack_36c = iStack_36c - iStack_34c;
      local_418 = (int)uVar4;
      iStack_414 = (int)((ulong)uVar4 >> 0x20);
      iStack_410 = (int)uVar5;
      iStack_40c = (int)((ulong)uVar5 >> 0x20);
      uVar34 = iStack_414 - iStack_354;
      iStack_40c = iStack_40c - iStack_34c;
      local_6d8 = CONCAT44(uVar34,local_418 + local_358 * -0x10);
      uStack_6d0 = CONCAT44(iStack_40c,iStack_410 - iStack_350);
      local_438 = (int)uVar6;
      iStack_434 = (int)((ulong)uVar6 >> 0x20);
      iStack_430 = (int)uVar7;
      iStack_42c = (int)((ulong)uVar7 >> 0x20);
      uVar35 = iStack_434 - iStack_354;
      iStack_42c = iStack_42c - iStack_34c;
      local_6e8 = CONCAT44(uVar35,local_438 + local_358 * -0x10);
      uStack_6e0 = CONCAT44(iStack_42c,iStack_430 - iStack_350);
      auVar27._8_8_ = uStack_6d0;
      auVar27._0_8_ = local_6d8;
      auVar26._8_8_ = uStack_6d0;
      auVar26._0_8_ = local_6d8;
      pmuldq(auVar27,auVar26);
      auVar25._4_4_ = 0;
      auVar25._0_4_ = uVar34;
      auVar24._4_4_ = 0;
      auVar24._0_4_ = uVar34;
      auVar25._8_4_ = iStack_40c;
      auVar25._12_4_ = 0;
      auVar24._8_4_ = iStack_40c;
      auVar24._12_4_ = 0;
      pmuldq(auVar25,auVar24);
      auVar23._8_8_ = uStack_6d0;
      auVar23._0_8_ = local_6d8;
      auVar22._8_8_ = uStack_6e0;
      auVar22._0_8_ = local_6e8;
      pmuldq(auVar23,auVar22);
      auVar21._4_4_ = 0;
      auVar21._0_4_ = uVar34;
      auVar20._4_4_ = 0;
      auVar20._0_4_ = uVar35;
      auVar21._8_4_ = iStack_40c;
      auVar21._12_4_ = 0;
      auVar20._8_4_ = iStack_42c;
      auVar20._12_4_ = 0;
      pmuldq(auVar21,auVar20);
      auVar19._8_8_ = uStack_6e0;
      auVar19._0_8_ = local_6e8;
      auVar18._8_8_ = uStack_6e0;
      auVar18._0_8_ = local_6e8;
      pmuldq(auVar19,auVar18);
      auVar17._4_4_ = 0;
      auVar17._0_4_ = uVar35;
      auVar16._4_4_ = 0;
      auVar16._0_4_ = uVar35;
      auVar17._8_4_ = iStack_42c;
      auVar17._12_4_ = 0;
      auVar16._8_4_ = iStack_42c;
      auVar16._12_4_ = 0;
      pmuldq(auVar17,auVar16);
      auVar14._4_4_ = uVar33;
      auVar14._0_4_ = iVar30;
      auVar14._12_4_ = iStack_36c;
      auVar14._8_4_ = iStack_370 - iStack_350;
      auVar15._8_8_ = uStack_6d0;
      auVar15._0_8_ = local_6d8;
      pmuldq(auVar15,auVar14);
      auVar13._4_4_ = 0;
      auVar13._0_4_ = uVar34;
      auVar12._4_4_ = 0;
      auVar12._0_4_ = uVar33;
      auVar13._8_4_ = iStack_40c;
      auVar13._12_4_ = 0;
      auVar12._8_4_ = iStack_36c;
      auVar12._12_4_ = 0;
      pmuldq(auVar13,auVar12);
      auVar10._4_4_ = uVar33;
      auVar10._0_4_ = iVar30;
      auVar10._12_4_ = iStack_36c;
      auVar10._8_4_ = iStack_370 - iStack_350;
      auVar11._8_8_ = uStack_6e0;
      auVar11._0_8_ = local_6e8;
      pmuldq(auVar11,auVar10);
      auVar9._4_4_ = 0;
      auVar9._0_4_ = uVar35;
      auVar8._4_4_ = 0;
      auVar8._0_4_ = uVar33;
      auVar9._8_4_ = iStack_42c;
      auVar9._12_4_ = 0;
      auVar8._8_4_ = iStack_36c;
      auVar8._12_4_ = 0;
      auVar2._4_8_ = 0;
      auVar2._0_4_ = (int)uVar35 >> 0x1f;
      auVar31._12_4_ = iStack_42c >> 0x1f;
      auVar31._0_12_ = auVar2 << 0x20;
      pblendw(auVar9,auVar31,0xcc);
      auVar3._4_8_ = 0;
      auVar3._0_4_ = (int)uVar33 >> 0x1f;
      auVar32._12_4_ = iStack_36c >> 0x1f;
      auVar32._0_12_ = auVar3 << 0x20;
      pblendw(auVar8,auVar32,0xcc);
      pmuldq(auVar9,auVar8);
    }
  }
  v[1] = in_RDX;
  v[0] = in_RSI;
  xx_storeu_128((void *)h1x_high[0],v);
  v_00[1] = extraout_RDX;
  v_00[0] = in_RSI;
  xx_storeu_128(in_stack_00000028,v_00);
  v_01[1] = extraout_RDX_00;
  v_01[0] = in_RSI;
  xx_storeu_128(in_stack_00000028 + 2,v_01);
  *in_stack_00000028 = *in_stack_00000028 / (long)iVar28;
  in_stack_00000028[1] = in_stack_00000028[1] / (long)iVar28;
  in_stack_00000028[3] = in_stack_00000028[3] / (long)iVar28;
  in_stack_00000028[2] = in_stack_00000028[1];
  *(long *)h1x_high[0] = *(long *)h1x_high[0] / (long)iVar28;
  *(long *)(h1x_high[0] + 8) = *(long *)(h1x_high[0] + 8) / (long)iVar28;
  return;
}

Assistant:

static inline void calc_proj_params_r0_r1_sse4_1(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int64_t H[2][2], int64_t C[2]) {
  const int size = width * height;
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  __m128i h00, h01, h11, c0, c1;
  const __m128i zero = _mm_setzero_si128();
  h01 = h11 = c0 = c1 = h00 = zero;

  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; j += 4) {
      const __m128i u_load = _mm_cvtepu8_epi32(
          _mm_cvtsi32_si128(*((int *)(dat + i * dat_stride + j))));
      const __m128i s_load = _mm_cvtepu8_epi32(
          _mm_cvtsi32_si128(*((int *)(src + i * src_stride + j))));
      __m128i f1 = _mm_loadu_si128((__m128i *)(flt0 + i * flt0_stride + j));
      __m128i f2 = _mm_loadu_si128((__m128i *)(flt1 + i * flt1_stride + j));
      __m128i d = _mm_slli_epi32(u_load, SGRPROJ_RST_BITS);
      __m128i s = _mm_slli_epi32(s_load, SGRPROJ_RST_BITS);
      s = _mm_sub_epi32(s, d);
      f1 = _mm_sub_epi32(f1, d);
      f2 = _mm_sub_epi32(f2, d);

      const __m128i h00_even = _mm_mul_epi32(f1, f1);
      const __m128i h00_odd =
          _mm_mul_epi32(_mm_srli_epi64(f1, 32), _mm_srli_epi64(f1, 32));
      h00 = _mm_add_epi64(h00, h00_even);
      h00 = _mm_add_epi64(h00, h00_odd);

      const __m128i h01_even = _mm_mul_epi32(f1, f2);
      const __m128i h01_odd =
          _mm_mul_epi32(_mm_srli_epi64(f1, 32), _mm_srli_epi64(f2, 32));
      h01 = _mm_add_epi64(h01, h01_even);
      h01 = _mm_add_epi64(h01, h01_odd);

      const __m128i h11_even = _mm_mul_epi32(f2, f2);
      const __m128i h11_odd =
          _mm_mul_epi32(_mm_srli_epi64(f2, 32), _mm_srli_epi64(f2, 32));
      h11 = _mm_add_epi64(h11, h11_even);
      h11 = _mm_add_epi64(h11, h11_odd);

      const __m128i c0_even = _mm_mul_epi32(f1, s);
      const __m128i c0_odd =
          _mm_mul_epi32(_mm_srli_epi64(f1, 32), _mm_srli_epi64(s, 32));
      c0 = _mm_add_epi64(c0, c0_even);
      c0 = _mm_add_epi64(c0, c0_odd);

      const __m128i c1_even = _mm_mul_epi32(f2, s);
      const __m128i c1_odd =
          _mm_mul_epi32(_mm_srli_epi64(f2, 32), _mm_srli_epi64(s, 32));
      c1 = _mm_add_epi64(c1, c1_even);
      c1 = _mm_add_epi64(c1, c1_odd);
    }
  }

  __m128i c_low = _mm_unpacklo_epi64(c0, c1);
  const __m128i c_high = _mm_unpackhi_epi64(c0, c1);
  c_low = _mm_add_epi64(c_low, c_high);

  __m128i h0x_low = _mm_unpacklo_epi64(h00, h01);
  const __m128i h0x_high = _mm_unpackhi_epi64(h00, h01);
  h0x_low = _mm_add_epi64(h0x_low, h0x_high);

  // Using the symmetric properties of H,  calculations of H[1][0] are not
  // needed.
  __m128i h1x_low = _mm_unpacklo_epi64(zero, h11);
  const __m128i h1x_high = _mm_unpackhi_epi64(zero, h11);
  h1x_low = _mm_add_epi64(h1x_low, h1x_high);

  xx_storeu_128(C, c_low);
  xx_storeu_128(H[0], h0x_low);
  xx_storeu_128(H[1], h1x_low);

  H[0][0] /= size;
  H[0][1] /= size;
  H[1][1] /= size;

  // Since H is a symmetric matrix
  H[1][0] = H[0][1];
  C[0] /= size;
  C[1] /= size;
}